

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

void __thiscall
ymfm::fm_channel<ymfm::opn_registers_base<false>_>::keyonoff
          (fm_channel<ymfm::opn_registers_base<false>_> *this,uint32_t states,keyon_type type,
          uint32_t chnum)

{
  fm_operator<ymfm::opn_registers_base<false>_> *pfVar1;
  byte bVar2;
  long lVar3;
  
  bVar2 = (byte)type & 0x1f;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    pfVar1 = this->m_op[lVar3];
    if (pfVar1 != (fm_operator<ymfm::opn_registers_base<false>_> *)0x0) {
      pfVar1->m_keyon_live =
           ((states >> ((uint)lVar3 & 0x1f) & 1) != 0) << ((byte)type & 0x1f) |
           pfVar1->m_keyon_live & ((byte)(-2 << bVar2) | (byte)(0xfffffffe >> 0x20 - bVar2));
    }
  }
  return;
}

Assistant:

void fm_channel<RegisterType>::keyonoff(uint32_t states, keyon_type type, uint32_t chnum)
{
	for (uint32_t opnum = 0; opnum < array_size(m_op); opnum++)
		if (m_op[opnum] != nullptr)
			m_op[opnum]->keyonoff(bitfield(states, opnum), type);

	if (debug::LOG_KEYON_EVENTS && ((debug::GLOBAL_FM_CHANNEL_MASK >> chnum) & 1) != 0)
		for (uint32_t opnum = 0; opnum < array_size(m_op); opnum++)
			if (m_op[opnum] != nullptr)
				debug::log_keyon("%c%s\n", bitfield(states, opnum) ? '+' : '-', m_regs.log_keyon(m_choffs, m_op[opnum]->opoffs()).c_str());
}